

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O1

void readoptions(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  istream *piVar5;
  _List_node_base *p_Var6;
  size_t sVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  long lVar10;
  ostream *poVar11;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  string *psVar14;
  char *pcVar15;
  string line;
  ifstream input;
  allocator local_475;
  int local_474;
  char **local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _List_node_base *local_448;
  undefined1 local_440 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  uint auStack_418 [120];
  long local_238 [65];
  
  local_474 = argc;
  local_470 = argv;
  std::ifstream::ifstream((istream *)local_238);
LAB_0011b4c3:
  do {
    while (iVar2 = getopt(local_474,local_470,"t:s:r:a:A:i:d:"), pcVar3 = _optarg, iVar2 < 0x69) {
      if (iVar2 < 0x61) {
        if (iVar2 != 0x41) {
          if (iVar2 == -1) {
            if (_optind < local_474) {
              lVar10 = (long)_optind;
              _optind = _optind + 1;
              config.input = local_470[lVar10];
              if (local_474 <= _optind) {
                if (config.type == SHOW_ALL) {
                  psVar14 = (string *)__cxa_allocate_exception(0x20);
                  *(string **)psVar14 = psVar14 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            (psVar14,"-t option is mandatory","");
                  __cxa_throw(psVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string)
                  ;
                }
                std::ifstream::~ifstream(local_238);
                return;
              }
            }
            else {
              usage(*local_470);
            }
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            local_440._0_8_ = local_440 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_440,"Unknown extra option: ","");
            std::operator+(pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_440,local_470[_optind]);
            __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
LAB_0011bbdc:
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          local_440._0_8_ = local_440 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Invalid option: ","")
          ;
          std::operator+(pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_440,optopt);
          __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::ifstream::ifstream((string *)local_440,_optarg,_S_in);
        std::ifstream::operator=((istream *)local_238,(ifstream *)local_440);
        std::ifstream::~ifstream((string *)local_440);
        local_440._0_8_ = local_440 + 0x10;
        local_440._8_8_ = 0;
        local_430._M_local_buf[0] = '\0';
        while( true ) {
          cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)local_440,cVar1);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          trim((string *)local_440);
          if ((1 < (ulong)local_440._8_8_) &&
             (iVar2 = std::__cxx11::string::compare((ulong)local_440,0,(char *)0x2), iVar2 != 0)) {
            std::__cxx11::string::substr((ulong)local_468,(ulong)local_440);
            std::__cxx11::string::operator=((string *)local_440,(string *)local_468);
            if (local_468[0] != &local_458) {
              operator_delete(local_468[0]);
            }
          }
          uVar12 = local_440._0_8_;
          if (local_440._8_8_ != 0) {
            piVar4 = __errno_location();
            iVar2 = *piVar4;
            *piVar4 = 0;
            p_Var8 = (_List_node_base *)strtoul((char *)uVar12,(char **)local_468,0x10);
            if (local_468[0] ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar12) {
              std::__throw_invalid_argument("stoul");
LAB_0011baac:
              std::__throw_out_of_range("stoul");
              goto LAB_0011bab8;
            }
            if (*piVar4 == 0) {
              *piVar4 = iVar2;
            }
            else if (*piVar4 == 0x22) goto LAB_0011baac;
            if (p_Var8 != (_List_node_base *)0x0) {
              p_Var6 = (_List_node_base *)operator_new(0x20);
              p_Var6[1]._M_next = p_Var8;
              p_Var6[1]._M_prev = p_Var8;
              std::__detail::_List_node_base::_M_hook(p_Var6);
              config.ranges.
              super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl._M_node._M_size =
                   config.ranges.
                   super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl._M_node._M_size + 1;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_440 + 0x10)) {
          operator_delete((void *)local_440._0_8_);
        }
        std::ifstream::close();
      }
      else if (iVar2 == 0x61) {
        iVar2 = strncasecmp(_optarg,"0x",2);
        if (iVar2 != 0) {
          _optarg = pcVar3 + 2;
        }
        std::__cxx11::string::string((string *)local_440,_optarg,&local_475);
        uVar12 = local_440._0_8_;
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        *piVar4 = 0;
        p_Var8 = (_List_node_base *)strtoul((char *)uVar12,(char **)local_468,0x10);
        if (local_468[0] ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar12) {
LAB_0011bab8:
          std::__throw_invalid_argument("stoul");
LAB_0011bac4:
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          local_440._0_8_ = local_440 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"invalid range: ","");
          std::operator+(pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_440,_optarg);
          __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar2;
        }
        else if (*piVar4 == 0x22) {
LAB_0011bc58:
          std::__throw_out_of_range("stoul");
LAB_0011bc64:
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          local_440._0_8_ = local_440 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"invalid type: ","");
          std::operator+(pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_440,_optarg);
          __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_440 + 0x10)) {
          operator_delete((void *)local_440._0_8_);
        }
        if (p_Var8 != (_List_node_base *)0x0) {
          p_Var9 = (_List_node_base *)operator_new(0x20);
          p_Var9[1]._M_next = p_Var8;
LAB_0011b9db:
          p_Var9[1]._M_prev = p_Var8;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          config.ranges.
          super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl._M_node._M_size =
               config.ranges.
               super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl._M_node._M_size + 1;
        }
      }
      else {
        if (iVar2 != 100) goto LAB_0011bbdc;
        config.dump = _optarg;
      }
    }
    if (0x72 < iVar2) {
      if (iVar2 == 0x73) {
        iVar2 = strcasecmp(_optarg,"all");
        if (iVar2 == 0) {
          config.show = SHOW_ALL;
        }
        else {
          iVar2 = strcasecmp(pcVar3,"valid");
          if (iVar2 == 0) {
            config.show = BFTRACE_TYPE;
          }
          else {
            iVar2 = strcasecmp(pcVar3,"invalid");
            if (iVar2 != 0) {
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              local_440._0_8_ = local_440 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_440,"invalid show: ","");
              std::operator+(pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_440,_optarg);
              __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            config.show = CFGGRIND_TYPE;
          }
        }
      }
      else {
        if (iVar2 != 0x74) goto LAB_0011bbdc;
        iVar2 = strcasecmp(_optarg,"bftrace");
        if (iVar2 == 0) {
          config.type = BFTRACE_TYPE;
        }
        else {
          iVar2 = strcasecmp(pcVar3,"cfggrind");
          if (iVar2 == 0) {
            config.type = CFGGRIND_TYPE;
          }
          else {
            iVar2 = strcasecmp(pcVar3,"dcfg");
            if (iVar2 != 0) goto LAB_0011bc64;
            config.type = DCFG_TYPE;
          }
        }
      }
      goto LAB_0011b4c3;
    }
    if (iVar2 != 0x69) {
      if (iVar2 != 0x72) goto LAB_0011bbdc;
      pcVar3 = strchr(_optarg,0x3a);
      if (pcVar3 == (char *)0x0) goto LAB_0011bac4;
      *pcVar3 = '\0';
      pcVar15 = _optarg;
      iVar2 = strncasecmp(_optarg,"0x",2);
      if (iVar2 != 0) {
        _optarg = pcVar15 + 2;
      }
      iVar2 = strncasecmp(pcVar3 + 1,"0x",2);
      pcVar15 = pcVar3 + 3;
      if (iVar2 == 0) {
        pcVar15 = pcVar3 + 1;
      }
      std::__cxx11::string::string((string *)local_440,_optarg,&local_475);
      uVar12 = local_440._0_8_;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      *piVar4 = 0;
      local_448 = (_List_node_base *)strtoul((char *)uVar12,(char **)local_468,0x10);
      if (local_468[0] ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar12) {
        std::__throw_invalid_argument("stoul");
      }
      else {
        if (*piVar4 != 0) {
          if (*piVar4 != 0x22) goto LAB_0011b930;
          std::__throw_out_of_range("stoul");
LAB_0011bc4c:
          std::__throw_out_of_range("stoul");
          goto LAB_0011bc58;
        }
        *piVar4 = iVar2;
LAB_0011b930:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_440 + 0x10)) {
          operator_delete((void *)local_440._0_8_);
        }
        local_440._0_8_ = local_440 + 0x10;
        sVar7 = strlen(pcVar15);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_440,pcVar15,pcVar15 + sVar7)
        ;
        uVar12 = local_440._0_8_;
        iVar2 = *piVar4;
        *piVar4 = 0;
        p_Var8 = (_List_node_base *)strtoul((char *)local_440._0_8_,(char **)local_468,0x10);
        if (local_468[0] !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar12) {
          if (*piVar4 == 0) {
            *piVar4 = iVar2;
          }
          else if (*piVar4 == 0x22) goto LAB_0011bc4c;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_440 + 0x10)) {
            operator_delete((void *)local_440._0_8_);
          }
          p_Var6 = local_448;
          if (p_Var8 < local_448) goto LAB_0011bb40;
          p_Var9 = (_List_node_base *)operator_new(0x20);
          p_Var9[1]._M_next = p_Var6;
          goto LAB_0011b9db;
        }
      }
      std::__throw_invalid_argument("stoul");
LAB_0011bb40:
      std::__cxx11::stringstream::stringstream((stringstream *)local_440);
      lVar10 = *(long *)(CONCAT71(local_430._M_allocated_capacity._1_7_,local_430._M_local_buf[0]) +
                        -0x18);
      *(uint *)((long)auStack_418 + lVar10) = *(uint *)((long)auStack_418 + lVar10) & 0xffffffb5 | 8
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_440 + 0x10),"invalid range: ",0xf);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_440 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," < ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      uVar12 = __cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      __cxa_throw(uVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    config.instrs = _optarg;
  } while( true );
}

Assistant:

void readoptions(int argc, char* argv[]) {
	int opt;
	char* idx;
	Addr start, end;
	std::ifstream input;

	while ((opt = getopt(argc, argv, "t:s:r:a:A:i:d:")) != -1) {
		switch (opt) {
			case 't':
				if (strcasecmp(optarg, "bftrace") == 0)
					config.type = Config::BFTRACE_TYPE;
				else if (strcasecmp(optarg, "cfggrind") == 0)
					config.type = Config::CFGGRIND_TYPE;
				else if (strcasecmp(optarg, "dcfg") == 0)
					config.type = Config::DCFG_TYPE;
				else
					throw std::string("invalid type: ") + optarg;

				break;
			case 's':
				if (strcasecmp(optarg, "all") == 0)
					config.show = Config::SHOW_ALL;
				else if (strcasecmp(optarg, "valid") == 0)
					config.show = Config::SHOW_VALID_ONLY;
				else if (strcasecmp(optarg, "invalid") == 0)
					config.show = Config::SHOW_INVALID_ONLY;
				else
					throw std::string("invalid show: ") + optarg;

				break;
			case 'r':
				idx = strchr(optarg, ':');
				if (!idx)
					throw std::string("invalid range: ") + optarg;

				*idx = 0;
				idx++;

				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;
				if (strncasecmp(idx, "0x", 2))
					idx += 2;

				start = std::stoul(optarg, 0, 16);
				end = std::stoul(idx, 0, 16);

				if (end < start) {
					std::stringstream ss;
					ss << std::hex;
					ss << "invalid range: " << end << " < " << start;

					throw ss.str();
				}

				config.ranges.push_back(std::make_pair(start, end));
				break;
			case 'a':
				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;

				start = std::stoul(optarg, 0, 16);
				if (start != 0)
					config.ranges.push_back(std::make_pair(start, start));
				break;
			case 'A':
				input = std::ifstream(optarg);
				for (std::string line; getline(input, line); ) {
					trim(line);

					if (line.length() >= 2 && line.compare(0, 2, "0x"))
						line = line.substr(2);

					if (line.empty())
						continue;

					start = std::stoul(line, 0, 16);
					if (start != 0)
						config.ranges.push_back(std::make_pair(start, start));
				}
				input.close();

				break;
			case 'i':
				config.instrs = optarg;
				break;
			case 'd':
				config.dump = optarg;
				break;
			default:
				throw std::string("Invalid option: ") + (char) optopt;
		}
	}

	if (optind >= argc)
		usage(argv[0]);

	config.input = argv[optind++];

	if (optind < argc)
		throw std::string("Unknown extra option: ") + argv[optind];

	if (config.type == Config::UNDEF_TYPE)
		throw std::string("-t option is mandatory");
}